

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.cpp
# Opt level: O1

void __thiscall
bal::CnfL0Index::rollback
          (CnfL0Index *this,container_size_t size,container_size_t instances_size,
          container_size_t container_size)

{
  uint *puVar1;
  anon_struct_16_4_c3204e78 *paVar2;
  uint *puVar3;
  uint uVar4;
  uint *puVar5;
  uint container_offset;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  insertion_point_t insertion_point;
  insertion_point_t local_5c;
  container_size_t local_4c;
  CnfL0Index *local_48;
  Container<unsigned_int> *local_40;
  uint *local_38;
  
  ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
  ::rollback((ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
              *)this,size,instances_size,container_size);
  container_offset = 0;
  (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
  super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>.
  super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
  .super_Container<bal::avl_tree_index_item_t>.size_ = 0;
  local_40 = &(this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
              super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
              .
              super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
              .instances_;
  (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
  super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>.
  super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
  .instances_.size_ = 0;
  Container<unsigned_int>::append(local_40,0xffffffff,instances_size);
  local_4c = container_size;
  local_48 = this;
  if (container_size != 0) {
    do {
      puVar1 = ((this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
                super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
                .
                super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
               .container_)->data_;
      uVar4 = (puVar1[(ulong)container_offset + 1] >> 1) - 1;
      uVar8 = (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
              super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
              .
              super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
              .instances_.size_;
      if (uVar8 <= uVar4) {
        Container<unsigned_int>::append
                  (local_40,0xffffffff,(puVar1[(ulong)container_offset + 1] >> 1) - uVar8);
        this = local_48;
      }
      local_5c.super_container_index_insertion_point_t.version_stamp =
           (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
           super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
           .
           super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
           .super_Container<bal::avl_tree_index_item_t>.size_;
      uVar8 = (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
              super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
              .
              super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
              .instances_.data_[uVar4];
      if (uVar8 == 0xffffffff) {
        local_5c.kind = btipkRoot;
        local_5c.offset = uVar4;
LAB_0010eab4:
        local_5c.super_container_index_insertion_point_t.container_offset = 0xffffffff;
      }
      else {
        paVar2 = (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
                 super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
                 .
                 super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
                 .super_Container<bal::avl_tree_index_item_t>.data_;
        puVar3 = ((this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
                  super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
                  .
                  super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
                 .container_)->data_;
        local_38 = puVar3 + 2;
        do {
          uVar6 = (ulong)paVar2[uVar8].container_offset;
          __compare_clauses_ = __compare_clauses_ + 1;
          uVar4 = puVar3[uVar6];
          uVar12 = puVar1[container_offset] & 0xffff;
          uVar11 = uVar4 & 0xffff;
          uVar9 = puVar1[container_offset];
          if (uVar11 < uVar12) {
            uVar9 = uVar4;
          }
          uVar9 = uVar9 & 0xffff;
          bVar14 = uVar9 != 0;
          if (bVar14) {
            uVar4 = puVar1[(ulong)container_offset + 1];
            uVar13 = puVar3[uVar6 + 1];
            bVar14 = true;
            if (uVar4 == uVar13) {
              uVar7 = 0;
              puVar5 = local_38;
              do {
                uVar4 = (uint)puVar5;
                if ((ulong)uVar9 - 1 == uVar7) {
                  bVar14 = false;
                  goto LAB_0010ea15;
                }
                uVar4 = puVar1[(ulong)container_offset + uVar7 + 2];
                puVar5 = (uint *)(ulong)uVar4;
                uVar13 = local_38[uVar6 + uVar7];
                uVar7 = uVar7 + 1;
              } while (uVar4 == uVar13);
              bVar14 = uVar7 < uVar9;
            }
            uVar4 = -(uint)(uVar4 < uVar13) | 1;
          }
LAB_0010ea15:
          uVar9 = (uint)(uVar12 != uVar11);
          if (uVar12 < uVar11) {
            uVar9 = 0xffffffff;
          }
          if (bVar14) {
            uVar9 = uVar4;
          }
          if ((int)uVar9 < 1) {
            if ((int)uVar9 < 0) {
              uVar4 = paVar2[uVar8].left_offset;
              if (uVar4 != 0xffffffff) goto LAB_0010ea3a;
              local_5c.kind = btipkLeft;
              goto LAB_0010ea6b;
            }
            local_5c.kind = btipkCurrent;
            local_5c.super_container_index_insertion_point_t.container_offset =
                 paVar2[uVar8].container_offset;
            iVar10 = 1;
            local_5c.offset = uVar8;
          }
          else {
            uVar4 = paVar2[uVar8].right_offset;
            if (uVar4 == 0xffffffff) {
              local_5c.kind = btipkRight;
LAB_0010ea6b:
              iVar10 = 3;
              local_5c.offset = uVar8;
            }
            else {
LAB_0010ea3a:
              iVar10 = 0;
              uVar8 = uVar4;
            }
          }
        } while (iVar10 == 0);
        this = local_48;
        if (iVar10 == 3) goto LAB_0010eab4;
      }
      if (local_5c.super_container_index_insertion_point_t.container_offset != 0xffffffff) {
        __assert_fail("offset_found == CONTAINER_END",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.cpp"
                      ,0x22,
                      "virtual void bal::CnfL0Index::rollback(const container_size_t, const container_size_t, const container_size_t)"
                     );
      }
      AvlTreesIndex<unsigned_int,_&bal::compare_clauses>::append
                (&this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>,&local_5c,
                 container_offset);
      container_offset = (ushort)puVar1[container_offset] + container_offset + 1;
    } while (container_offset < local_4c);
  }
  return;
}

Assistant:

void CnfL0Index::rollback(const container_size_t size,
                          const container_size_t instances_size,
                          const container_size_t container_size) {
        base_t::rollback(size, instances_size, container_size);
        this->size_ = 0;
        this->instances_.size_ = 0;
        this->instances_.append(CONTAINER_END, instances_size);
        container_offset_t container_offset = 0;
        while (container_offset < container_size) {
            const uint32_t* const p_clause = this->container_.data_ + container_offset;            
            insertion_point_t insertion_point;
            this->find(literal_t__variable_id(_clause_literal(p_clause, 0)), p_clause, insertion_point);
            container_offset_t offset_found = insertion_point.container_offset;
            assert(offset_found == CONTAINER_END);
            this->append(insertion_point, container_offset);
            container_offset += _clause_size(p_clause) + 1;
        };
    }